

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O1

bool __thiscall
QAbstractSocket::setSocketDescriptor
          (QAbstractSocket *this,qintptr socketDescriptor,SocketState socketState,OpenMode openMode)

{
  QAbstractSocketPrivate *this_00;
  QHostAddressPrivate *pQVar1;
  char cVar2;
  char cVar3;
  quint16 qVar4;
  int iVar5;
  SocketError SVar6;
  QAbstractSocketEngine *pQVar7;
  int iVar8;
  long in_FS_OFFSET;
  SocketState local_5c;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSocketPrivate **)&this->field_0x8;
  QAbstractSocketPrivate::resetSocketLayer(this_00);
  iVar8 = (int)this_00;
  QIODevicePrivate::setReadChannelCount(iVar8);
  QIODevicePrivate::setWriteChannelCount(iVar8);
  pQVar7 = QAbstractSocketEngine::createSocketEngine(socketDescriptor,(QObject *)this);
  this_00->socketEngine = pQVar7;
  if (pQVar7 == (QAbstractSocketEngine *)0x0) {
    QMetaObject::tr((char *)&local_58,(char *)&staticMetaObject,0x264d1b);
    this_00->socketError = UnsupportedSocketOperationError;
    QString::operator=((QString *)&this_00->field_0x168,(QString *)&local_58);
    if ((QHostAddressPrivate *)local_58.d.d != (QHostAddressPrivate *)0x0) {
      LOCK();
      (((QSharedData *)&(local_58.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((QSharedData *)&(local_58.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QSharedData *)&(local_58.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    cVar2 = '\0';
  }
  else {
    cVar2 = (**(code **)(*(long *)pQVar7 + 0x68))(pQVar7,socketDescriptor,socketState);
    if (cVar2 == '\0') {
      SVar6 = QAbstractSocketEngine::error((QAbstractSocketEngine *)this_00->socketEngine);
      QAbstractSocketEngine::errorString(&local_58,(QAbstractSocketEngine *)this_00->socketEngine);
      this_00->socketError = SVar6;
      QString::operator=((QString *)&this_00->field_0x168,(QString *)&local_58);
      if ((QHostAddressPrivate *)local_58.d.d != (QHostAddressPrivate *)0x0) {
        LOCK();
        (((QSharedData *)&(local_58.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             (((QSharedData *)&(local_58.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QSharedData *)&(local_58.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      this_00->socketError = UnknownSocketError;
      if (*(long *)(*(long *)&this_00->field_0x58 + 0x60) != 0) {
        QAbstractSocketEngine::setReceiver
                  ((QAbstractSocketEngine *)this_00->socketEngine,
                   &this_00->super_QAbstractSocketEngineReceiver);
      }
      QIODevice::open(this,openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                           super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
      if (socketState == ConnectedState) {
        cVar3 = QIODevice::isReadable();
        if (cVar3 != '\0') {
          iVar5 = QAbstractSocketEngine::inboundStreamCount
                            ((QAbstractSocketEngine *)this_00->socketEngine);
          QIODevicePrivate::setReadChannelCount(iVar8);
          if (iVar5 == 0) {
            *(undefined4 *)&this_00->field_0xa8 = 0;
          }
        }
        cVar3 = QIODevice::isWritable();
        if (cVar3 != '\0') {
          iVar5 = QAbstractSocketEngine::outboundStreamCount
                            ((QAbstractSocketEngine *)this_00->socketEngine);
          QIODevicePrivate::setWriteChannelCount(iVar8);
          if (iVar5 == 0) {
            *(undefined4 *)&this_00->field_0xac = 0;
          }
        }
      }
      else {
        *(undefined8 *)&this_00->field_0xa8 = 0;
      }
      if (this_00->state != socketState) {
        this_00->state = socketState;
        local_58.d.ptr = (char16_t *)&local_5c;
        local_58.d.d = (Data *)0x0;
        local_5c = socketState;
        QMetaObject::activate((QObject *)this,&staticMetaObject,3,(void **)&local_58);
      }
      this_00->pendingClose = false;
      (**(code **)(*(long *)this_00->socketEngine + 0x140))(this_00->socketEngine,1);
      qVar4 = QAbstractSocketEngine::localPort((QAbstractSocketEngine *)this_00->socketEngine);
      this_00->localPort = qVar4;
      qVar4 = QAbstractSocketEngine::peerPort((QAbstractSocketEngine *)this_00->socketEngine);
      this_00->peerPort = qVar4;
      QAbstractSocketEngine::localAddress((QAbstractSocketEngine *)&local_58);
      pQVar1 = (this_00->localAddress).d.d.ptr;
      (this_00->localAddress).d.d.ptr = (QHostAddressPrivate *)local_58.d.d;
      local_58.d.d = (Data *)pQVar1;
      QHostAddress::~QHostAddress((QHostAddress *)&local_58);
      QAbstractSocketEngine::peerAddress((QAbstractSocketEngine *)&local_58);
      pQVar1 = (this_00->peerAddress).d.d.ptr;
      (this_00->peerAddress).d.d.ptr = (QHostAddressPrivate *)local_58.d.d;
      local_58.d.d = (Data *)pQVar1;
      QHostAddress::~QHostAddress((QHostAddress *)&local_58);
      this_00->cachedSocketDescriptor = socketDescriptor;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)cVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QAbstractSocket::setSocketDescriptor(qintptr socketDescriptor, SocketState socketState,
                                          OpenMode openMode)
{
    Q_D(QAbstractSocket);

    d->resetSocketLayer();
    d->setReadChannelCount(0);
    d->setWriteChannelCount(0);
    d->socketEngine = QAbstractSocketEngine::createSocketEngine(socketDescriptor, this);
    if (!d->socketEngine) {
        d->setError(UnsupportedSocketOperationError, tr("Operation on socket is not supported"));
        return false;
    }
    bool result = d->socketEngine->initialize(socketDescriptor, socketState);
    if (!result) {
        d->setError(d->socketEngine->error(), d->socketEngine->errorString());
        return false;
    }

    // Sync up with error string, which open() shall clear.
    d->socketError = UnknownSocketError;
    if (d->threadData.loadRelaxed()->hasEventDispatcher())
        d->socketEngine->setReceiver(d);

    QIODevice::open(openMode);

    if (socketState == ConnectedState) {
        if (isReadable()) {
            const int inboundStreamCount = d->socketEngine->inboundStreamCount();
            d->setReadChannelCount(qMax(1, inboundStreamCount));
            if (inboundStreamCount == 0)
                d->readChannelCount = 0;
        }
        if (isWritable()) {
            const int outboundStreamCount = d->socketEngine->outboundStreamCount();
            d->setWriteChannelCount(qMax(1, outboundStreamCount));
            if (outboundStreamCount == 0)
                d->writeChannelCount = 0;
        }
    } else {
        d->readChannelCount = d->writeChannelCount = 0;
    }

    if (d->state != socketState) {
        d->state = socketState;
        emit stateChanged(d->state);
    }

    d->pendingClose = false;
    d->socketEngine->setReadNotificationEnabled(true);
    d->localPort = d->socketEngine->localPort();
    d->peerPort = d->socketEngine->peerPort();
    d->localAddress = d->socketEngine->localAddress();
    d->peerAddress = d->socketEngine->peerAddress();
    d->cachedSocketDescriptor = socketDescriptor;

    return true;
}